

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O0

string * __thiscall kws::Parser::ExtractLine_abi_cxx11_(Parser *this,size_t pos)

{
  ulong in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t p;
  allocator local_21;
  ulong local_20;
  ulong local_18;
  
  local_18 = in_RDX;
  local_20 = std::__cxx11::string::find((char *)(in_RSI + 0x4f8),0x1d8c2a);
  if (local_18 < local_20) {
    std::__cxx11::string::substr((ulong)in_RDI,in_RSI + 0x4f8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return in_RDI;
}

Assistant:

std::string Parser::ExtractLine(size_t pos)
{
  size_t p = m_Buffer.find("\n",pos);
  if(p>pos)
    {
    return m_Buffer.substr(pos,p-pos-1);
    }
  return "";
}